

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20250127::container_internal::AssertIsFull
               (ctrl_t *ctrl,GenerationType generation,GenerationType *generation_ptr,
               char *operation)

{
  bool bVar1;
  ctrl_t *pcVar2;
  undefined8 in_R9;
  ctrl_t *pcVar3;
  char *absl_raw_log_internal_basename_2;
  char *absl_raw_log_internal_basename_1;
  char *absl_raw_log_internal_basename;
  char *operation_local;
  GenerationType *generation_ptr_local;
  GenerationType generation_local;
  ctrl_t *ctrl_local;
  
  if (ctrl == (ctrl_t *)0x0) {
    raw_log_internal::RawLog(kFatal,"raw_hash_set.h",0x65c,"%s called on end() iterator.",operation)
    ;
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x65c,
                  "void absl::container_internal::AssertIsFull(const ctrl_t *, GenerationType, const GenerationType *, const char *)"
                 );
  }
  pcVar3 = ctrl;
  pcVar2 = EmptyGroup();
  if (pcVar3 == pcVar2) {
    raw_log_internal::RawLog
              (kFatal,"raw_hash_set.h",0x660,"%s called on default-constructed iterator.",operation)
    ;
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x660,
                  "void absl::container_internal::AssertIsFull(const ctrl_t *, GenerationType, const GenerationType *, const char *)"
                 );
  }
  bVar1 = IsFull(*ctrl);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  raw_log_internal::RawLog
            (kFatal,"raw_hash_set.h",0x676,
             "%s called on invalid iterator. The element might have been erased or the table might have rehashed. Consider running with --config=asan to diagnose rehashing issues."
             ,operation,in_R9,pcVar3,"raw_hash_set.h");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x676,
                "void absl::container_internal::AssertIsFull(const ctrl_t *, GenerationType, const GenerationType *, const char *)"
               );
}

Assistant:

inline void AssertIsFull(const ctrl_t* ctrl, GenerationType generation,
                         const GenerationType* generation_ptr,
                         const char* operation) {
  if (!SwisstableDebugEnabled()) return;
  // `SwisstableDebugEnabled()` is also true for release builds with hardening
  // enabled. To minimize their impact in those builds:
  // - use `ABSL_PREDICT_FALSE()` to provide a compiler hint for code layout
  // - use `ABSL_RAW_LOG()` with a format string to reduce code size and improve
  //   the chances that the hot paths will be inlined.
  if (ABSL_PREDICT_FALSE(ctrl == nullptr)) {
    ABSL_RAW_LOG(FATAL, "%s called on end() iterator.", operation);
  }
  if (ABSL_PREDICT_FALSE(ctrl == EmptyGroup())) {
    ABSL_RAW_LOG(FATAL, "%s called on default-constructed iterator.",
                 operation);
  }
  if (SwisstableGenerationsEnabled()) {
    if (ABSL_PREDICT_FALSE(generation != *generation_ptr)) {
      ABSL_RAW_LOG(FATAL,
                   "%s called on invalid iterator. The table could have "
                   "rehashed or moved since this iterator was initialized.",
                   operation);
    }
    if (ABSL_PREDICT_FALSE(!IsFull(*ctrl))) {
      ABSL_RAW_LOG(
          FATAL,
          "%s called on invalid iterator. The element was likely erased.",
          operation);
    }
  } else {
    if (ABSL_PREDICT_FALSE(!IsFull(*ctrl))) {
      ABSL_RAW_LOG(
          FATAL,
          "%s called on invalid iterator. The element might have been erased "
          "or the table might have rehashed. Consider running with "
          "--config=asan to diagnose rehashing issues.",
          operation);
    }
  }
}